

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

sexp_conflict
sexp_25_send_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg2,
                 sexp_conflict arg3,sexp_conflict arg5,sexp_conflict arg6,sexp_conflict arg7,
                 sexp_conflict arg8)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  sexp_conflict timeout;
  int *in_RCX;
  long in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  int *in_R9;
  uint *in_stack_00000008;
  int *in_stack_00000010;
  sexp_conflict res;
  size_t in_stack_ffffffffffffff50;
  size_t len;
  void *buffer;
  undefined4 in_stack_ffffffffffffff70;
  sexp_conflict in_stack_ffffffffffffff78;
  sexp_conflict local_80;
  sexp_conflict local_8;
  
  if (((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) || (((ulong)in_RCX & 1) == 1)) {
    if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 8)) {
      if ((((ulong)in_R9 & 1) == 1) || ((((ulong)in_R9 & 3) == 0 && (*in_R9 == 0xc)))) {
        if (((((ulong)in_stack_00000008 & 3) == 0) &&
            (uVar1 = *(ulong *)(*(long *)(in_RSI + 0x48) + 0x28), auVar2._8_8_ = (long)uVar1 >> 0x3f
            , auVar2._0_8_ = uVar1 & 0xfffffffffffffffe,
            (ulong)*in_stack_00000008 == SUB168(auVar2 / SEXT816(2),0))) ||
           (in_stack_00000008 == (uint *)0x3e)) {
          if ((((ulong)in_stack_00000010 & 1) == 1) ||
             ((((ulong)in_stack_00000010 & 3) == 0 && (*in_stack_00000010 == 0xc)))) {
            if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) {
              timeout = *(sexp_conflict *)(in_RCX + 4);
            }
            else {
              auVar4._8_8_ = (long)in_RCX >> 0x3f;
              auVar4._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
              timeout = SUB168(auVar4 / SEXT816(2),0);
            }
            if (((ulong)in_R9 & 1) == 1) {
              auVar5._8_8_ = (long)in_R9 >> 0x3f;
              auVar5._0_8_ = (ulong)in_R9 & 0xfffffffffffffffe;
              local_80 = SUB168(auVar5 / SEXT816(2),0);
            }
            else if ((((ulong)in_R9 & 3) == 0) && (*in_R9 == 0xc)) {
              in_stack_ffffffffffffff78 =
                   (sexp_conflict)((long)(char)in_R9[2] * *(long *)(in_R9 + 6));
              local_80 = in_stack_ffffffffffffff78;
            }
            else {
              in_stack_ffffffffffffff78 = (sexp_conflict)0x0;
              local_80 = in_stack_ffffffffffffff78;
            }
            if (in_stack_00000008 == (uint *)0x3e) {
              buffer = (void *)0x0;
            }
            else {
              buffer = *(void **)(in_stack_00000008 + 6);
            }
            if (((ulong)in_stack_00000010 & 1) == 1) {
              auVar6._8_8_ = (long)in_stack_00000010 >> 0x3f;
              auVar6._0_8_ = (ulong)in_stack_00000010 & 0xfffffffffffffffe;
              len = SUB168(auVar6 / SEXT816(2),0);
            }
            else if ((((ulong)in_stack_00000010 & 3) == 0) && (*in_stack_00000010 == 0xc)) {
              in_stack_ffffffffffffff50 =
                   (long)(char)in_stack_00000010[2] * *(long *)(in_stack_00000010 + 6);
              len = in_stack_ffffffffffffff50;
            }
            else {
              in_stack_ffffffffffffff50 = 0;
              len = in_stack_ffffffffffffff50;
            }
            local_8 = sexp_sendto(in_stack_ffffffffffffff78,
                                  (sexp_conflict)CONCAT44((int)local_80,in_stack_ffffffffffffff70),
                                  (int)((ulong)buffer >> 0x20),buffer,len,
                                  (int)(in_stack_ffffffffffffff50 >> 0x20),(sockaddr *)(in_R8 + 4),
                                  (socklen_t)*(undefined8 *)(in_R8 + 2),timeout);
          }
          else {
            local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_stack_00000010);
          }
        }
        else {
          uVar1 = *(ulong *)(*(long *)(in_RSI + 0x48) + 0x28);
          auVar3._8_8_ = (long)uVar1 >> 0x3f;
          auVar3._0_8_ = uVar1 & 0xfffffffffffffffe;
          local_8 = (sexp_conflict)
                    sexp_type_exception(in_RDI,in_RSI,SUB168(auVar3 / SEXT816(2),0),
                                        in_stack_00000008);
        }
      }
      else {
        local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R9);
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,8,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x12,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_25_send_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg2, sexp arg3, sexp arg5, sexp arg6, sexp arg7, sexp arg8) {
  sexp res;
  if (! (sexp_filenop(arg2) || sexp_fixnump(arg2)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg2);
  if (! sexp_bytesp(arg3))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg3);
  if (! sexp_exact_integerp(arg5))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg5);
  if (! ((sexp_pointerp(arg6) && (sexp_pointer_tag(arg6) == sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_THREE)))) || sexp_not(arg6)))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_THREE)), arg6);
  if (! sexp_exact_integerp(arg7))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg7);
  res = sexp_sendto(ctx, self, (sexp_filenop(arg2) ? sexp_fileno_fd(arg2) : sexp_unbox_fixnum(arg2)), sexp_bytes_data(arg3), sexp_bytes_length(arg3), sexp_sint_value(arg5), (struct sockaddr*)sexp_cpointer_maybe_null_value(arg6), sexp_sint_value(arg7), arg8);
  return res;
}